

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

pcut_item_t * pcut_get_real_next(pcut_item_t *item)

{
  bool bVar1;
  pcut_item_t *local_18;
  pcut_item_t *item_local;
  
  local_18 = item;
  if (item == (pcut_item_t *)0x0) {
    item_local = (pcut_item_t *)0x0;
  }
  else {
    do {
      local_18 = local_18->next;
      bVar1 = false;
      if (local_18 != (pcut_item_t *)0x0) {
        bVar1 = local_18->kind == 0;
      }
      item_local = local_18;
    } while (bVar1);
  }
  return item_local;
}

Assistant:

pcut_item_t *pcut_get_real_next(pcut_item_t *item) {
	if (item == NULL) {
		return NULL;
	}

	do {
		item = item->next;
	} while ((item != NULL) && (item->kind == PCUT_KIND_SKIP));


	return item;
}